

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O0

MockSupport * __thiscall MockSupport::getMockSupport(MockSupport *this,MockNamedValueListNode *node)

{
  bool bVar1;
  int iVar2;
  MockNamedValue *pMVar3;
  undefined4 extraout_var;
  bool local_7b;
  SimpleString local_78;
  byte local_61;
  SimpleString local_60 [2];
  SimpleString local_40;
  SimpleString local_30;
  MockNamedValueListNode *local_20;
  MockNamedValueListNode *node_local;
  MockSupport *this_local;
  
  local_20 = node;
  node_local = (MockNamedValueListNode *)this;
  MockNamedValueListNode::getType((MockNamedValueListNode *)&local_30);
  local_61 = 0;
  SimpleString::SimpleString(&local_40,"MockSupport");
  bVar1 = operator==(&local_30,&local_40);
  local_7b = false;
  if (bVar1) {
    MockNamedValueListNode::getName((MockNamedValueListNode *)local_60);
    local_61 = 1;
    SimpleString::SimpleString(&local_78,"!!!$$$MockingSupportScope$$$!!!");
    local_7b = SimpleString::contains(local_60,&local_78);
    SimpleString::~SimpleString(&local_78);
  }
  if ((local_61 & 1) != 0) {
    SimpleString::~SimpleString(local_60);
  }
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&local_30);
  if (local_7b == false) {
    this_local = (MockSupport *)0x0;
  }
  else {
    pMVar3 = MockNamedValueListNode::item(local_20);
    iVar2 = (*pMVar3->_vptr_MockNamedValue[0x28])();
    this_local = (MockSupport *)CONCAT44(extraout_var,iVar2);
  }
  return this_local;
}

Assistant:

MockSupport* MockSupport::getMockSupport(MockNamedValueListNode* node)
{
    if (node->getType() == "MockSupport" && node->getName().contains(MOCK_SUPPORT_SCOPE_PREFIX))
        return (MockSupport*) node->item()->getObjectPointer();
    return NULLPTR;
}